

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Global_get(w3Interp *this)

{
  w3Tag wVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  w3Tag *pwVar5;
  reference pvVar6;
  ulong uVar7;
  TaggedValue t;
  string local_b0;
  ulong local_90;
  Value local_88;
  w3StackValue local_80;
  byte local_39;
  string local_38;
  ulong local_18;
  size_t i;
  w3Interp *this_local;
  
  uVar7 = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
  local_18 = uVar7;
  i = (size_t)this;
  sVar3 = std::vector<Global,_std::allocator<Global>_>::size(&this->module->globals);
  uVar2 = local_18;
  local_39 = 0;
  if (sVar3 <= uVar7) {
    sVar3 = std::vector<Global,_std::allocator<Global>_>::size(&this->module->globals);
    StringFormat_abi_cxx11_(&local_38,"%lX %lX",uVar2,sVar3);
    local_39 = 1;
    AssertFailedFormat("i < module->globals.size ()",&local_38);
  }
  if ((local_39 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  pvVar4 = std::vector<w3StackValue,_std::allocator<w3StackValue>_>::operator[]
                     (&this->module_instance->globals,local_18);
  local_90 = *(ulong *)&pvVar4->value;
  local_88 = (Value)(pvVar4->value).value.u64;
  t._0_8_ = local_90 & 0xff;
  t.value = (Value)(Value)local_88.u64;
  w3StackValue::w3StackValue(&local_80,t);
  w3Stack::push_value(&this->super_w3Stack,&local_80);
  pwVar5 = w3Stack::tag(&this->super_w3Stack);
  wVar1 = *pwVar5;
  pvVar6 = std::vector<Global,_std::allocator<Global>_>::operator[](&this->module->globals,local_18)
  ;
  if (wVar1 != (pvVar6->global_type).value_type) {
    pwVar5 = w3Stack::tag(&this->super_w3Stack);
    wVar1 = *pwVar5;
    pvVar6 = std::vector<Global,_std::allocator<Global>_>::operator[]
                       (&this->module->globals,local_18);
    StringFormat_abi_cxx11_(&local_b0,"%X %X",(ulong)wVar1,(ulong)(pvVar6->global_type).value_type);
    AssertFailedFormat("tag () == module->globals [i].global_type.value_type",&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return;
}

Assistant:

INTERP (Global_get)
{
    const size_t i = instr->u32;
    AssertFormat (i < module->globals.size (), ("%" FORMAT_SIZE "X %" FORMAT_SIZE "X", i, module->globals.size ()));
    push_value (w3StackValue (module_instance->globals [i].value));
    AssertFormat (tag () == module->globals [i].global_type.value_type, ("%X %X", tag (), module->globals [i].global_type.value_type));
}